

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexCompareVerifier.cpp
# Opt level: O3

bool tcu::isTexCompareResultValid
               (Texture2DView *texture,Sampler *sampler,TexComparePrecision *prec,Vec2 *coord,
               Vec2 *lodBounds,float cmpReference,float result)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  FilterMode FVar5;
  int iVar6;
  int iVar7;
  float fVar8;
  undefined1 auVar9 [16];
  float __x;
  float __x_00;
  Vec2 local_38;
  
  __x = (float)*(undefined8 *)lodBounds->m_data;
  __x_00 = (float)((ulong)*(undefined8 *)lodBounds->m_data >> 0x20);
  fVar8 = sampler->lodThreshold;
  if (__x <= fVar8) {
    bVar1 = isLevelCompareResultValid
                      (texture->m_levels,sampler,sampler->magFilter,prec,coord,0,cmpReference,result
                      );
    if (bVar1) {
      return bVar1;
    }
    if (__x_00 <= fVar8) {
      return bVar1;
    }
LAB_00aa76e6:
    FVar5 = sampler->minFilter;
    if (FVar5 - NEAREST_MIPMAP_NEAREST < 4) {
      iVar6 = texture->m_numLevels;
      switch(FVar5) {
      default:
        iVar6 = iVar6 + -1;
        fVar8 = ceilf(__x + 0.5);
        iVar2 = (int)fVar8 + -1;
        iVar7 = iVar6;
        if (iVar2 < iVar6) {
          iVar7 = iVar2;
        }
        if (iVar2 < 0) {
          iVar7 = 0;
        }
        fVar8 = floorf(__x_00 + 0.5);
        iVar2 = (int)fVar8;
        if (iVar2 < iVar6) {
          iVar6 = iVar2;
        }
        if (iVar2 < 0) {
          iVar6 = 0;
        }
        if (iVar6 < iVar7) {
          return false;
        }
        do {
          uVar3 = sampler->minFilter - LINEAR;
          FVar5 = NEAREST;
          if (uVar3 < 5) {
            FVar5 = *(FilterMode *)(&DAT_00b7e490 + (ulong)uVar3 * 4);
          }
          bVar1 = isLevelCompareResultValid
                            (texture->m_levels + iVar7,sampler,FVar5,prec,coord,0,cmpReference,
                             result);
          if (bVar1) goto LAB_00aa78c5;
          iVar7 = iVar7 + 1;
        } while (iVar7 <= iVar6);
        goto LAB_00aa76a0;
      case NEAREST_MIPMAP_LINEAR:
      case LINEAR_MIPMAP_LINEAR:
        fVar8 = floorf(__x);
        iVar2 = (int)fVar8;
        iVar6 = iVar6 + -2;
        iVar7 = iVar6;
        if (iVar2 < iVar6) {
          iVar7 = iVar2;
        }
        if (iVar2 < 0) {
          iVar7 = 0;
        }
        fVar8 = floorf(__x_00);
        iVar2 = (int)fVar8;
        if (iVar2 < iVar6) {
          iVar6 = iVar2;
        }
        if (iVar2 < 0) {
          iVar6 = 0;
        }
        do {
          FVar5 = NEAREST;
          if (iVar6 < iVar7) {
            return false;
          }
          uVar3 = sampler->minFilter - LINEAR;
          if (uVar3 < 5) {
            FVar5 = *(FilterMode *)(&DAT_00b7e490 + (ulong)uVar3 * 4);
          }
          fVar8 = (float)iVar7;
          auVar9._4_4_ = __x_00 - fVar8;
          auVar9._0_4_ = __x - fVar8;
          auVar9._8_4_ = 0.0 - fVar8;
          auVar9._12_4_ = 0.0 - fVar8;
          auVar9 = minps(_DAT_00ad8ca0,auVar9);
          lVar4 = (long)iVar7;
          iVar7 = iVar7 + 1;
          local_38.m_data[1] = (float)(-(uint)(0.0 <= __x_00 - fVar8) & auVar9._4_4_);
          local_38.m_data[0] = (float)(-(uint)(0.0 <= __x - fVar8) & auVar9._0_4_);
          bVar1 = isMipmapLinearCompareResultValid
                            (texture->m_levels + lVar4,texture->m_levels + iVar7,sampler,FVar5,prec,
                             coord,0,&local_38,cmpReference,result);
        } while (!bVar1);
      }
    }
    else {
      bVar1 = isLevelCompareResultValid
                        (texture->m_levels,sampler,FVar5,prec,coord,0,cmpReference,result);
      if (!bVar1) {
        return false;
      }
    }
LAB_00aa78c5:
    bVar1 = true;
  }
  else {
    if (fVar8 < __x_00) goto LAB_00aa76e6;
LAB_00aa76a0:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool isTexCompareResultValid (const Texture2DView&			texture,
							  const Sampler&				sampler,
							  const TexComparePrecision&	prec,
							  const Vec2&					coord,
							  const Vec2&					lodBounds,
							  const float					cmpReference,
							  const float					result)
{
	const float		minLod			= lodBounds.x();
	const float		maxLod			= lodBounds.y();
	const bool		canBeMagnified	= minLod <= sampler.lodThreshold;
	const bool		canBeMinified	= maxLod > sampler.lodThreshold;

	DE_ASSERT(isSamplerSupported(sampler));

	if (canBeMagnified)
	{
		if (isLevelCompareResultValid(texture.getLevel(0), sampler, sampler.magFilter, prec, coord, 0, cmpReference, result))
			return true;
	}

	if (canBeMinified)
	{
		const bool	isNearestMipmap	= isNearestMipmapFilter(sampler.minFilter);
		const bool	isLinearMipmap	= isLinearMipmapFilter(sampler.minFilter);
		const int	minTexLevel		= 0;
		const int	maxTexLevel		= texture.getNumLevels()-1;

		DE_ASSERT(minTexLevel < maxTexLevel);

		if (isLinearMipmap)
		{
			const int		minLevel		= de::clamp((int)deFloatFloor(minLod), minTexLevel, maxTexLevel-1);
			const int		maxLevel		= de::clamp((int)deFloatFloor(maxLod), minTexLevel, maxTexLevel-1);

			DE_ASSERT(minLevel <= maxLevel);

			for (int level = minLevel; level <= maxLevel; level++)
			{
				const float		minF	= de::clamp(minLod - float(level), 0.0f, 1.0f);
				const float		maxF	= de::clamp(maxLod - float(level), 0.0f, 1.0f);

				if (isMipmapLinearCompareResultValid(texture.getLevel(level), texture.getLevel(level+1), sampler, getLevelFilter(sampler.minFilter), prec, coord, 0, Vec2(minF, maxF), cmpReference, result))
					return true;
			}
		}
		else if (isNearestMipmap)
		{
			// \note The accurate formula for nearest mipmapping is level = ceil(lod + 0.5) - 1 but Khronos has made
			//		 decision to allow floor(lod + 0.5) as well.
			const int		minLevel		= de::clamp((int)deFloatCeil(minLod + 0.5f) - 1,	minTexLevel, maxTexLevel);
			const int		maxLevel		= de::clamp((int)deFloatFloor(maxLod + 0.5f),		minTexLevel, maxTexLevel);

			DE_ASSERT(minLevel <= maxLevel);

			for (int level = minLevel; level <= maxLevel; level++)
			{
				if (isLevelCompareResultValid(texture.getLevel(level), sampler, getLevelFilter(sampler.minFilter), prec, coord, 0, cmpReference, result))
					return true;
			}
		}
		else
		{
			if (isLevelCompareResultValid(texture.getLevel(0), sampler, sampler.minFilter, prec, coord, 0, cmpReference, result))
				return true;
		}
	}

	return false;
}